

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9HashmapDup(jx9_hashmap *pSrc,jx9_hashmap *pDest)

{
  jx9_value *pValue;
  uint local_78;
  int local_74;
  sxu32 n;
  sxi32 rc;
  jx9_value *pVal;
  jx9_value sKey;
  jx9_hashmap_node *pEntry;
  jx9_hashmap *pDest_local;
  jx9_hashmap *pSrc_local;
  
  if (pSrc != pDest) {
    sKey._56_8_ = pSrc->pFirst;
    for (local_78 = 0; local_78 < pSrc->nEntry; local_78 = local_78 + 1) {
      pValue = HashmapExtractNodeValue((jx9_hashmap_node *)sKey._56_8_);
      if (*(int *)(sKey._56_8_ + 8) == 2) {
        jx9MemObjInitFromString(pDest->pVm,(jx9_value *)&pVal,(SyString *)0x0);
        jx9MemObjStringAppend
                  ((jx9_value *)&pVal,*(char **)(sKey._56_8_ + 0x18),*(sxu32 *)(sKey._56_8_ + 0x20))
        ;
        local_74 = jx9HashmapInsert(pDest,(jx9_value *)&pVal,pValue);
        jx9MemObjRelease((jx9_value *)&pVal);
      }
      else {
        local_74 = HashmapInsertIntKey(pDest,*(sxi64 *)(sKey._56_8_ + 0x10),pValue);
      }
      if (local_74 != 0) {
        return local_74;
      }
      sKey._56_8_ = *(undefined8 *)(sKey._56_8_ + 0x48);
    }
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9HashmapDup(jx9_hashmap *pSrc, jx9_hashmap *pDest)
{
	jx9_hashmap_node *pEntry;
	jx9_value sKey, *pVal;
	sxi32 rc;
	sxu32 n;
	if( pSrc == pDest ){
		/* Same map. This can easily happen since hashmaps are passed by reference.
		 * Unlike the  engine.
		 */
		return SXRET_OK;
	}
	/* Point to the first inserted entry in the source */
	pEntry = pSrc->pFirst;
	/* Perform the duplication */
	for( n = 0 ; n < pSrc->nEntry ; ++n ){
		/* Extract the node value */
		pVal = HashmapExtractNodeValue(pEntry);
		if( pEntry->iType == HASHMAP_BLOB_NODE ){
			/* Blob key insertion */
			jx9MemObjInitFromString(pDest->pVm, &sKey, 0);
			jx9MemObjStringAppend(&sKey, (const char *)SyBlobData(&pEntry->xKey.sKey), SyBlobLength(&pEntry->xKey.sKey));
			rc = jx9HashmapInsert(&(*pDest), &sKey, pVal);
			jx9MemObjRelease(&sKey);
		}else{
			/* Int key insertion */
			rc = HashmapInsertIntKey(&(*pDest), pEntry->xKey.iKey, pVal);
		}
		if( rc != SXRET_OK ){
			return rc;
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	return SXRET_OK;
}